

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctflt.c
# Opt level: O2

void jpeg_fdct_float(float *data)

{
  int iVar1;
  float *pfVar2;
  float *dataptr;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  pfVar2 = data;
  for (iVar1 = 7; -1 < iVar1; iVar1 = iVar1 + -1) {
    fVar7 = *pfVar2 + pfVar2[7];
    fVar5 = *pfVar2 - pfVar2[7];
    fVar8 = pfVar2[1] + pfVar2[6];
    fVar3 = pfVar2[1] - pfVar2[6];
    fVar9 = pfVar2[2] + pfVar2[5];
    fVar6 = pfVar2[2] - pfVar2[5];
    fVar4 = pfVar2[4];
    fVar11 = pfVar2[3] + fVar4;
    fVar10 = fVar7 + fVar11;
    fVar7 = fVar7 - fVar11;
    fVar11 = fVar8 + fVar9;
    *pfVar2 = fVar11 + fVar10;
    pfVar2[4] = fVar10 - fVar11;
    fVar8 = ((fVar8 - fVar9) + fVar7) * 0.70710677;
    pfVar2[2] = fVar7 + fVar8;
    pfVar2[6] = fVar7 - fVar8;
    fVar8 = (pfVar2[3] - fVar4) + fVar6;
    fVar4 = fVar3 + fVar5;
    fVar7 = (fVar8 - fVar4) * 0.38268343;
    fVar8 = fVar8 * 0.5411961 + fVar7;
    fVar7 = fVar4 * 1.306563 + fVar7;
    fVar4 = (fVar6 + fVar3) * 0.70710677;
    fVar3 = fVar5 + fVar4;
    fVar5 = fVar5 - fVar4;
    pfVar2[5] = fVar5 + fVar8;
    pfVar2[3] = fVar5 - fVar8;
    pfVar2[1] = fVar3 + fVar7;
    pfVar2[7] = fVar3 - fVar7;
    pfVar2 = pfVar2 + 8;
  }
  for (iVar1 = 7; -1 < iVar1; iVar1 = iVar1 + -1) {
    fVar7 = *data + data[0x38];
    fVar5 = *data - data[0x38];
    fVar8 = data[8] + data[0x30];
    fVar3 = data[8] - data[0x30];
    fVar9 = data[0x10] + data[0x28];
    fVar6 = data[0x10] - data[0x28];
    fVar4 = data[0x20];
    fVar11 = data[0x18] + fVar4;
    fVar10 = fVar7 + fVar11;
    fVar7 = fVar7 - fVar11;
    fVar11 = fVar8 + fVar9;
    *data = fVar11 + fVar10;
    data[0x20] = fVar10 - fVar11;
    fVar8 = ((fVar8 - fVar9) + fVar7) * 0.70710677;
    data[0x10] = fVar7 + fVar8;
    data[0x30] = fVar7 - fVar8;
    fVar8 = (data[0x18] - fVar4) + fVar6;
    fVar4 = fVar3 + fVar5;
    fVar7 = (fVar8 - fVar4) * 0.38268343;
    fVar8 = fVar8 * 0.5411961 + fVar7;
    fVar7 = fVar4 * 1.306563 + fVar7;
    fVar4 = (fVar6 + fVar3) * 0.70710677;
    fVar3 = fVar5 + fVar4;
    fVar5 = fVar5 - fVar4;
    data[0x28] = fVar5 + fVar8;
    data[0x18] = fVar5 - fVar8;
    data[8] = fVar3 + fVar7;
    data[0x38] = fVar3 - fVar7;
    data = data + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_float(FAST_FLOAT *data)
{
  FAST_FLOAT tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  FAST_FLOAT tmp10, tmp11, tmp12, tmp13;
  FAST_FLOAT z1, z2, z3, z4, z5, z11, z13;
  FAST_FLOAT *dataptr;
  int ctr;

  /* Pass 1: process rows. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[0] + dataptr[7];
    tmp7 = dataptr[0] - dataptr[7];
    tmp1 = dataptr[1] + dataptr[6];
    tmp6 = dataptr[1] - dataptr[6];
    tmp2 = dataptr[2] + dataptr[5];
    tmp5 = dataptr[2] - dataptr[5];
    tmp3 = dataptr[3] + dataptr[4];
    tmp4 = dataptr[3] - dataptr[4];

    /* Even part */

    tmp10 = tmp0 + tmp3;        /* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[0] = tmp10 + tmp11; /* phase 3 */
    dataptr[4] = tmp10 - tmp11;

    z1 = (tmp12 + tmp13) * ((FAST_FLOAT)0.707106781); /* c4 */
    dataptr[2] = tmp13 + z1;    /* phase 5 */
    dataptr[6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;        /* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = (tmp10 - tmp12) * ((FAST_FLOAT)0.382683433); /* c6 */
    z2 = ((FAST_FLOAT)0.541196100) * tmp10 + z5; /* c2-c6 */
    z4 = ((FAST_FLOAT)1.306562965) * tmp12 + z5; /* c2+c6 */
    z3 = tmp11 * ((FAST_FLOAT)0.707106781); /* c4 */

    z11 = tmp7 + z3;            /* phase 5 */
    z13 = tmp7 - z3;

    dataptr[5] = z13 + z2;      /* phase 6 */
    dataptr[3] = z13 - z2;
    dataptr[1] = z11 + z4;
    dataptr[7] = z11 - z4;

    dataptr += DCTSIZE;         /* advance pointer to next row */
  }

  /* Pass 2: process columns. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE * 0] + dataptr[DCTSIZE * 7];
    tmp7 = dataptr[DCTSIZE * 0] - dataptr[DCTSIZE * 7];
    tmp1 = dataptr[DCTSIZE * 1] + dataptr[DCTSIZE * 6];
    tmp6 = dataptr[DCTSIZE * 1] - dataptr[DCTSIZE * 6];
    tmp2 = dataptr[DCTSIZE * 2] + dataptr[DCTSIZE * 5];
    tmp5 = dataptr[DCTSIZE * 2] - dataptr[DCTSIZE * 5];
    tmp3 = dataptr[DCTSIZE * 3] + dataptr[DCTSIZE * 4];
    tmp4 = dataptr[DCTSIZE * 3] - dataptr[DCTSIZE * 4];

    /* Even part */

    tmp10 = tmp0 + tmp3;        /* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE * 0] = tmp10 + tmp11; /* phase 3 */
    dataptr[DCTSIZE * 4] = tmp10 - tmp11;

    z1 = (tmp12 + tmp13) * ((FAST_FLOAT)0.707106781); /* c4 */
    dataptr[DCTSIZE * 2] = tmp13 + z1; /* phase 5 */
    dataptr[DCTSIZE * 6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;        /* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = (tmp10 - tmp12) * ((FAST_FLOAT)0.382683433); /* c6 */
    z2 = ((FAST_FLOAT)0.541196100) * tmp10 + z5; /* c2-c6 */
    z4 = ((FAST_FLOAT)1.306562965) * tmp12 + z5; /* c2+c6 */
    z3 = tmp11 * ((FAST_FLOAT)0.707106781); /* c4 */

    z11 = tmp7 + z3;            /* phase 5 */
    z13 = tmp7 - z3;

    dataptr[DCTSIZE * 5] = z13 + z2; /* phase 6 */
    dataptr[DCTSIZE * 3] = z13 - z2;
    dataptr[DCTSIZE * 1] = z11 + z4;
    dataptr[DCTSIZE * 7] = z11 - z4;

    dataptr++;                  /* advance pointer to next column */
  }
}